

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O3

int __thiscall ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  int local_48;
  
  local_48 = bottom_blob->h;
  iVar12 = bottom_blob->c;
  uVar4 = bottom_blob->h;
  uVar5 = iVar12 / this->group;
  iVar10 = -100;
  if (iVar12 == this->group * uVar5) {
    iVar1 = bottom_blob->w;
    uVar2 = bottom_blob->elemsize;
    auVar15._0_4_ = -(uint)(top_blob->dims == 3);
    auVar15._4_4_ = -(uint)(iVar1 == top_blob->w);
    auVar15._8_4_ = -(uint)(local_48 == top_blob->h);
    auVar15._12_4_ = -(uint)(iVar12 == top_blob->c);
    iVar6 = movmskps(uVar5,auVar15);
    if ((iVar6 == 0xf) && (top_blob->elemsize == uVar2)) {
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      uVar13 = top_blob->cstep;
    }
    else {
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = uVar2;
      top_blob->dims = 3;
      top_blob->w = iVar1;
      top_blob->h = local_48;
      top_blob->c = iVar12;
      uVar13 = ((long)(local_48 * iVar1) * uVar2 + 0xf & 0xfffffffffffffff0) / uVar2;
      top_blob->cstep = uVar13;
      if ((long)iVar12 * uVar13 == 0) {
        return -100;
      }
      lVar14 = (long)iVar12 * uVar13 * uVar2;
      pvVar8 = malloc(lVar14 + 0x1c);
      pvVar9 = (void *)((long)pvVar8 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar8;
      top_blob->data = pvVar9;
      top_blob->refcount = (int *)((long)pvVar9 + lVar14);
      *(undefined4 *)((long)pvVar9 + lVar14) = 1;
      iVar12 = top_blob->c;
      local_48 = uVar4;
    }
    if ((long)iVar12 * uVar13 != 0) {
      uVar7 = this->group;
      if (uVar7 != 0) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          if (uVar5 != 0) {
            uVar11 = 0;
            do {
              memcpy((void *)(((long)(int)uVar11 * (long)this->group + uVar13) * top_blob->cstep *
                              top_blob->elemsize + (long)top_blob->data),
                     (void *)((lVar14 + uVar11) * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data),uVar2 * (long)(local_48 * iVar1));
              uVar11 = uVar11 + 1;
            } while (uVar5 != uVar11);
            uVar7 = this->group;
          }
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + (int)uVar5;
        } while (uVar13 != uVar7);
      }
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}